

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

UINT8 device_start_es5503(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  ES5503Chip *chip_00;
  UINT8 *pUVar2;
  ES5503Chip *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  chip_00 = (ES5503Chip *)calloc(1,0x358);
  if (chip_00 == (ES5503Chip *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    chip_00->irq_func = (_func_void_void_ptr_UINT8 *)0x0;
    chip_00->irq_param = (void *)0x0;
    chip_00->adc_func = (_func_UINT8_void_ptr_UINT8 *)0x0;
    chip_00->adc_param = (void *)0x0;
    chip_00->dramsize = 0x20000;
    pUVar2 = (UINT8 *)malloc((ulong)chip_00->dramsize);
    chip_00->docram = pUVar2;
    chip_00->clock = cfg->clock;
    chip_00->output_channels = cfg->flags;
    if (chip_00->output_channels == '\0') {
      chip_00->output_channels = '\x01';
    }
    UVar1 = pow2_mask((uint)chip_00->output_channels);
    chip_00->outchn_mask = (UINT8)UVar1;
    chip_00->oscsenabled = '\x01';
    UVar1 = es5503_get_sample_rate(chip_00);
    chip_00->output_rate = UVar1;
    es5503_set_mute_mask(chip_00,0);
    chip_00->_devData = (DEV_DATA)chip_00;
    INIT_DEVINF(retDevInf,(DEV_DATA *)chip_00,chip_00->output_rate,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_es5503(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ES5503Chip *chip;

	chip = (ES5503Chip *)calloc(1, sizeof(ES5503Chip));
	if (chip == NULL)
		return 0xFF;
	
	chip->irq_func = NULL;
	chip->irq_param = NULL;
	chip->adc_func = NULL;
	chip->adc_param = NULL;
	
	chip->dramsize = 0x20000;	// 128 KB
	chip->docram = (UINT8*)malloc(chip->dramsize);
	chip->clock = cfg->clock;

	chip->output_channels = cfg->flags;
	if (! chip->output_channels)
		chip->output_channels = 1;
	chip->outchn_mask = (UINT8)pow2_mask(chip->output_channels);

	chip->oscsenabled = 1;
	chip->output_rate = es5503_get_sample_rate(chip);
	
	es5503_set_mute_mask(chip, 0x00000000);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->output_rate, &devDef);
	
	return 0x00;
}